

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O0

uint8_t ** __thiscall
Inter_Symbol_Generator::identity_matrix_generate
          (Inter_Symbol_Generator *this,uint32_t row,uint32_t col)

{
  ostream *this_00;
  uint local_30;
  uint local_2c;
  int j;
  int i;
  uint8_t **matrix;
  uint32_t col_local;
  uint32_t row_local;
  Inter_Symbol_Generator *this_local;
  
  if (row == col) {
    this_local = (Inter_Symbol_Generator *)new_matrix(this,row,col);
    for (local_2c = 0; local_2c < row; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < col; local_30 = local_30 + 1) {
        if (local_2c == local_30) {
          *(uint8_t *)((long)(&this_local->G_LDPC)[(int)local_2c] + (long)(int)local_30) = '\x01';
        }
      }
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"row is not equal to col!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local = (Inter_Symbol_Generator *)0x0;
  }
  return (uint8_t **)this_local;
}

Assistant:

uint8_t** Inter_Symbol_Generator::identity_matrix_generate(uint32_t row, uint32_t col)
{
	uint8_t **matrix;

	if (row != col)
	{
		std::cerr << "row is not equal to col!" << std::endl;
		return NULL;
	}


	matrix = new_matrix(row, col);

	for (int i = 0; i < row; i++)
	{
		for (int j = 0; j < col; j++)
		{
			if (i == j)
			{
				matrix[i][j] = 1;
			}
			
		}
	}

	return matrix;
}